

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O1

hash_t __thiscall duckdb::Hash<duckdb::string_t>(duckdb *this,string_t val)

{
  ulong uVar1;
  ulong uVar2;
  hash_t hVar3;
  string_t val_local;
  
  val_local.value.pointer.length = (uint32_t)this;
  val_local.value.pointer.prefix = SUB84((ulong)this >> 0x20,0);
  val_local.value._8_4_ = val.value._0_4_;
  val_local.value._12_4_ = val.value._4_4_;
  uVar2 = (ulong)this & 0xffffffff;
  if (uVar2 < 0xd) {
    uVar1 = (uVar2 * -0x395b586ca42e166b ^
             CONCAT44(val_local.value._8_4_,val_local.value.pointer.prefix) ^ 0xe17a1465) *
            -0x2917014799a6026d;
    if (uVar2 == 0) {
      uVar1 = 0xe17a1465;
    }
    uVar2 = ((uint)val_local.value._12_4_ ^ uVar1) * -0x2917014799a6026d;
    if (val_local.value.pointer.length < 9) {
      uVar2 = uVar1;
    }
    uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
    uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
    return uVar2 >> 0x20 ^ uVar2;
  }
  hVar3 = HashBytes<true>(val.value._0_8_,uVar2);
  return hVar3;
}

Assistant:

hash_t Hash(string_t val) {
	// If the string is inlined, we can do a branchless hash
	if (val.IsInlined()) {
		// This seed slightly improves bit distribution, taken from here:
		// https://github.com/martinus/robin-hood-hashing/blob/3.11.5/LICENSE
		// MIT License Copyright (c) 2018-2021 Martin Ankerl
		hash_t h = 0xe17a1465U ^ (val.GetSize() * 0xc6a4a7935bd1e995U);

		// Hash/combine the first 8-byte block
		if (!val.Empty()) {
			h ^= Load<hash_t>(const_data_ptr_cast(val.GetPrefix()));
			h *= 0xd6e8feb86659fd93U;
		}

		// Load remaining 4 bytes
		if (val.GetSize() > sizeof(hash_t)) {
			hash_t hr = 0;
			memcpy(&hr, const_data_ptr_cast(val.GetPrefix()) + sizeof(hash_t), 4U);

			h ^= hr;
			h *= 0xd6e8feb86659fd93U;
		}

		// Finalize
		h = Hash(h);

		// This is just an optimization. It should not change the result
		// This property is important for verification (e.g., DUCKDB_DEBUG_NO_INLINE)
		D_ASSERT(h == Hash(val.GetData(), val.GetSize()));

		return h;
	}
	// Required for DUCKDB_DEBUG_NO_INLINE
	return HashBytes<string_t::INLINE_LENGTH >= sizeof(hash_t)>(const_data_ptr_cast(val.GetData()), val.GetSize());
}